

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t feat_order(wchar_t feat)

{
  _Bool _Var1;
  wchar_t local_c;
  wchar_t feat_local;
  
  _Var1 = flag_has_dbg(f_info[feat].flags,4,0x15,"f_info[feat].flags","TF_SHOP");
  if (_Var1) {
    local_c = L'\x06';
  }
  else {
    _Var1 = flag_has_dbg(f_info[feat].flags,4,0x1a,"f_info[feat].flags","TF_STAIR");
    if (_Var1) {
      local_c = L'\x02';
    }
    else {
      _Var1 = flag_has_dbg(f_info[feat].flags,4,0x13,"f_info[feat].flags","TF_DOOR_ANY");
      if (_Var1) {
        local_c = L'\x01';
      }
      else {
        _Var1 = flag_has_dbg(f_info[feat].flags,4,0x18,"f_info[feat].flags","TF_MAGMA");
        if ((!_Var1) &&
           (_Var1 = flag_has_dbg(f_info[feat].flags,4,0x19,"f_info[feat].flags","TF_QUARTZ"), !_Var1
           )) {
          _Var1 = flag_has_dbg(f_info[feat].flags,4,0x10,"f_info[feat].flags","TF_WALL");
          if (_Var1) {
            return L'\x03';
          }
          _Var1 = flag_has_dbg(f_info[feat].flags,4,0x11,"f_info[feat].flags","TF_ROCK");
          if (!_Var1) {
            _Var1 = flag_has_dbg(f_info[feat].flags,4,3,"f_info[feat].flags","TF_PASSABLE");
            if (!_Var1) {
              return L'\a';
            }
            return L'\0';
          }
          return L'\x05';
        }
        local_c = L'\x04';
      }
    }
  }
  return local_c;
}

Assistant:

static int feat_order(int feat)
{
	if (tf_has(f_info[feat].flags, TF_SHOP)) return 6;
	if (tf_has(f_info[feat].flags, TF_STAIR)) return 2;
	if (tf_has(f_info[feat].flags, TF_DOOR_ANY)) return 1;
	/* These also have WALL set so check them first before checking WALL. */
	if (tf_has(f_info[feat].flags, TF_MAGMA)
		|| tf_has(f_info[feat].flags, TF_QUARTZ)) return 4;
	/* These also have ROCK set so check them first before checking ROCK. */
	if (tf_has(f_info[feat].flags, TF_WALL)) return 3;
	if (tf_has(f_info[feat].flags, TF_ROCK)) return 5;
	/* Many above have PASSABLE so do this last. */
	if (tf_has(f_info[feat].flags, TF_PASSABLE)) return 0;
	return 7;
}